

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_validate_value(lysp_ctx *ctx,yang_arg val_type,char *val)

{
  LY_ERR LVar1;
  ly_ctx *local_58;
  ly_ctx *local_50;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  size_t utf8_char_len;
  uint32_t c;
  ly_bool first;
  uint8_t prefix;
  char *val_local;
  lysp_ctx *plStack_18;
  yang_arg val_type_local;
  lysp_ctx *ctx_local;
  
  utf8_char_len._7_1_ = 0;
  utf8_char_len._6_1_ = '\x01';
  _c = val;
  val_local._4_4_ = val_type;
  plStack_18 = ctx;
  if (val == (char *)0x0) {
    if (val_type == Y_MAYBE_STR_ARG) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      if (ctx == (lysp_ctx *)0x0) {
        local_50 = (ly_ctx *)0x0;
      }
      else {
        local_50 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX,"Missing an expected string.");
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  else {
    while (*_c != '\0') {
      LVar1 = ly_getutf8((char **)&c,(uint32_t *)&utf8_char_len,(size_t *)&ret___1);
      if (LVar1 != LY_SUCCESS) {
        if (plStack_18 == (lysp_ctx *)0x0) {
          local_58 = (ly_ctx *)0x0;
        }
        else {
          local_58 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
                (ulong)(uint)(int)_c[-_ret___1]);
        return LY_EVALID;
      }
      if (val_local._4_4_ == Y_IDENTIF_ARG) {
        LVar1 = lysp_check_identifierchar
                          (plStack_18,(uint32_t)utf8_char_len,utf8_char_len._6_1_,(uint8_t *)0x0);
joined_r0x001b929a:
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
      else {
        if (val_local._4_4_ == Y_PREF_IDENTIF_ARG) {
          LVar1 = lysp_check_identifierchar
                            (plStack_18,(uint32_t)utf8_char_len,utf8_char_len._6_1_,
                             (uint8_t *)((long)&utf8_char_len + 7));
          goto joined_r0x001b929a;
        }
        if (val_local._4_4_ - Y_STR_ARG < 2) {
          LVar1 = lysp_check_stringchar(plStack_18,(uint32_t)utf8_char_len);
          goto joined_r0x001b929a;
        }
      }
      utf8_char_len._6_1_ = '\0';
    }
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_validate_value(struct lysp_ctx *ctx, enum yang_arg val_type, const char *val)
{
    uint8_t prefix = 0;
    ly_bool first = 1;
    uint32_t c;
    size_t utf8_char_len;

    if (!val) {
        if (val_type == Y_MAYBE_STR_ARG) {
            /* fine */
            return LY_SUCCESS;
        }

        LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Missing an expected string.");
        return LY_EVALID;
    }

    while (*val) {
        LY_CHECK_ERR_RET(ly_getutf8(&val, &c, &utf8_char_len),
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, (val)[-utf8_char_len]), LY_EVALID);

        switch (val_type) {
        case Y_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, NULL));
            break;
        case Y_PREF_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, &prefix));
            break;
        case Y_STR_ARG:
        case Y_MAYBE_STR_ARG:
            LY_CHECK_RET(lysp_check_stringchar(ctx, c));
            break;
        }
        first = 0;
    }

    return LY_SUCCESS;
}